

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

int solvegotos(LexState *ls,Labeldesc *lb)

{
  Dyndata *pDVar1;
  Labellist *pLVar2;
  uint local_28;
  int local_24;
  int needsclose;
  int i;
  Labellist *gl;
  Labeldesc *lb_local;
  LexState *ls_local;
  
  pDVar1 = ls->dyd;
  pLVar2 = &pDVar1->gt;
  local_24 = ls->fs->bl->firstgoto;
  local_28 = 0;
  while (local_24 < (pDVar1->gt).n) {
    if (pLVar2->arr[local_24].name == lb->name) {
      local_28 = pLVar2->arr[local_24].close | local_28;
      solvegoto(ls,local_24,lb);
    }
    else {
      local_24 = local_24 + 1;
    }
  }
  return local_28;
}

Assistant:

static int solvegotos (LexState *ls, Labeldesc *lb) {
  Labellist *gl = &ls->dyd->gt;
  int i = ls->fs->bl->firstgoto;
  int needsclose = 0;
  while (i < gl->n) {
    if (eqstr(gl->arr[i].name, lb->name)) {
      needsclose |= gl->arr[i].close;
      solvegoto(ls, i, lb);  /* will remove 'i' from the list */
    }
    else
      i++;
  }
  return needsclose;
}